

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O2

void read_debug_pred_weight_table(h264_stream_t *h,bs_t *b)

{
  int iVar1;
  slice_header_t *psVar2;
  sps_t *psVar3;
  pps_t *ppVar4;
  uint32_t uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  FILE *pFVar9;
  int (*paiVar10) [2];
  long lVar11;
  
  psVar2 = h->sh;
  pFVar9 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar9 = _stdout;
  }
  psVar3 = h->sps;
  ppVar4 = h->pps;
  fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar5 = bs_read_ue(b);
  (psVar2->pwt).luma_log2_weight_denom = uVar5;
  pFVar9 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar9 = _stdout;
  }
  fprintf(pFVar9,"sh->pwt.luma_log2_weight_denom: %d \n",(ulong)uVar5);
  if (psVar3->chroma_format_idc != 0) {
    pFVar9 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar9 = _stdout;
    }
    fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar5 = bs_read_ue(b);
    (psVar2->pwt).chroma_log2_weight_denom = uVar5;
    pFVar9 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar9 = _stdout;
    }
    fprintf(pFVar9,"sh->pwt.chroma_log2_weight_denom: %d \n",(ulong)uVar5);
  }
  paiVar10 = (psVar2->pwt).chroma_offset_l0;
  for (lVar11 = 0; lVar11 <= ppVar4->num_ref_idx_l0_active_minus1; lVar11 = lVar11 + 1) {
    pFVar9 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar9 = _stdout;
    }
    fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar5 = bs_read_u1(b);
    (psVar2->pwt).luma_weight_l0_flag[lVar11] = uVar5;
    pFVar9 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar9 = _stdout;
    }
    fprintf(pFVar9,"sh->pwt.luma_weight_l0_flag[i]: %d \n",(ulong)uVar5);
    if ((psVar2->pwt).luma_weight_l0_flag[lVar11] != 0) {
      pFVar9 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar9 = _stdout;
      }
      fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar6 = bs_read_se(b);
      (psVar2->pwt).luma_weight_l0[lVar11] = uVar6;
      pFVar9 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar9 = _stdout;
      }
      fprintf(pFVar9,"sh->pwt.luma_weight_l0[ i ]: %d \n",(ulong)uVar6);
      pFVar9 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar9 = _stdout;
      }
      fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar6 = bs_read_se(b);
      (psVar2->pwt).luma_offset_l0[lVar11] = uVar6;
      pFVar9 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar9 = _stdout;
      }
      fprintf(pFVar9,"sh->pwt.luma_offset_l0[ i ]: %d \n",(ulong)uVar6);
    }
    if (psVar3->chroma_format_idc != 0) {
      pFVar9 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar9 = _stdout;
      }
      fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar5 = bs_read_u1(b);
      (psVar2->pwt).chroma_weight_l0_flag[lVar11] = uVar5;
      pFVar9 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar9 = _stdout;
      }
      fprintf(pFVar9,"sh->pwt.chroma_weight_l0_flag[i]: %d \n",(ulong)uVar5);
      if ((psVar2->pwt).chroma_weight_l0_flag[lVar11] != 0) {
        for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
          pFVar9 = (FILE *)h264_dbgfile;
          if (h264_dbgfile == (FILE *)0x0) {
            pFVar9 = _stdout;
          }
          fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
          uVar6 = bs_read_se(b);
          paiVar10[-0x40][lVar8] = uVar6;
          pFVar9 = (FILE *)h264_dbgfile;
          if (h264_dbgfile == (FILE *)0x0) {
            pFVar9 = _stdout;
          }
          fprintf(pFVar9,"sh->pwt.chroma_weight_l0[ i ][ j ]: %d \n",(ulong)uVar6);
          pFVar9 = (FILE *)h264_dbgfile;
          if (h264_dbgfile == (FILE *)0x0) {
            pFVar9 = _stdout;
          }
          fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
          uVar6 = bs_read_se(b);
          (*paiVar10)[lVar8] = uVar6;
          pFVar9 = (FILE *)h264_dbgfile;
          if (h264_dbgfile == (FILE *)0x0) {
            pFVar9 = _stdout;
          }
          fprintf(pFVar9,"sh->pwt.chroma_offset_l0[ i ][ j ]: %d \n",(ulong)uVar6);
        }
      }
    }
    paiVar10 = paiVar10 + 1;
  }
  iVar1 = psVar2->slice_type;
  iVar7 = iVar1 + -5;
  if (iVar1 < 5) {
    iVar7 = iVar1;
  }
  if (iVar7 == 1) {
    paiVar10 = (psVar2->pwt).chroma_offset_l1;
    for (lVar11 = 0; lVar11 <= ppVar4->num_ref_idx_l1_active_minus1; lVar11 = lVar11 + 1) {
      pFVar9 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar9 = _stdout;
      }
      fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar5 = bs_read_u1(b);
      (psVar2->pwt).luma_weight_l1_flag[lVar11] = uVar5;
      pFVar9 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar9 = _stdout;
      }
      fprintf(pFVar9,"sh->pwt.luma_weight_l1_flag[i]: %d \n",(ulong)uVar5);
      if ((psVar2->pwt).luma_weight_l1_flag[lVar11] != 0) {
        pFVar9 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar9 = _stdout;
        }
        fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
        uVar6 = bs_read_se(b);
        (psVar2->pwt).luma_weight_l1[lVar11] = uVar6;
        pFVar9 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar9 = _stdout;
        }
        fprintf(pFVar9,"sh->pwt.luma_weight_l1[ i ]: %d \n",(ulong)uVar6);
        pFVar9 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar9 = _stdout;
        }
        fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
        uVar6 = bs_read_se(b);
        (psVar2->pwt).luma_offset_l1[lVar11] = uVar6;
        pFVar9 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar9 = _stdout;
        }
        fprintf(pFVar9,"sh->pwt.luma_offset_l1[ i ]: %d \n",(ulong)uVar6);
      }
      if (psVar3->chroma_format_idc != 0) {
        pFVar9 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar9 = _stdout;
        }
        fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
        uVar5 = bs_read_u1(b);
        (psVar2->pwt).chroma_weight_l1_flag[lVar11] = uVar5;
        pFVar9 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar9 = _stdout;
        }
        fprintf(pFVar9,"sh->pwt.chroma_weight_l1_flag[i]: %d \n",(ulong)uVar5);
        if ((psVar2->pwt).chroma_weight_l1_flag[lVar11] != 0) {
          for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
            pFVar9 = (FILE *)h264_dbgfile;
            if (h264_dbgfile == (FILE *)0x0) {
              pFVar9 = _stdout;
            }
            fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
            uVar6 = bs_read_se(b);
            paiVar10[-0x40][lVar8] = uVar6;
            pFVar9 = (FILE *)h264_dbgfile;
            if (h264_dbgfile == (FILE *)0x0) {
              pFVar9 = _stdout;
            }
            fprintf(pFVar9,"sh->pwt.chroma_weight_l1[ i ][ j ]: %d \n",(ulong)uVar6);
            pFVar9 = (FILE *)h264_dbgfile;
            if (h264_dbgfile == (FILE *)0x0) {
              pFVar9 = _stdout;
            }
            fprintf(pFVar9,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
            uVar6 = bs_read_se(b);
            (*paiVar10)[lVar8] = uVar6;
            pFVar9 = (FILE *)h264_dbgfile;
            if (h264_dbgfile == (FILE *)0x0) {
              pFVar9 = _stdout;
            }
            fprintf(pFVar9,"sh->pwt.chroma_offset_l1[ i ][ j ]: %d \n",(ulong)uVar6);
          }
        }
      }
      paiVar10 = paiVar10 + 1;
    }
  }
  return;
}

Assistant:

void read_debug_pred_weight_table(h264_stream_t* h, bs_t* b)
{
    slice_header_t* sh = h->sh;
    sps_t* sps = h->sps;
    pps_t* pps = h->pps;

    int i, j;

    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.luma_log2_weight_denom = bs_read_ue(b); printf("sh->pwt.luma_log2_weight_denom: %d \n", sh->pwt.luma_log2_weight_denom); 
    if( sps->chroma_format_idc != 0 ) //FIXME ChromaArrayType may differ from chroma_format_idc
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.chroma_log2_weight_denom = bs_read_ue(b); printf("sh->pwt.chroma_log2_weight_denom: %d \n", sh->pwt.chroma_log2_weight_denom); 
    }
    for( i = 0; i <= pps->num_ref_idx_l0_active_minus1; i++ )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.luma_weight_l0_flag[i] = bs_read_u1(b); printf("sh->pwt.luma_weight_l0_flag[i]: %d \n", sh->pwt.luma_weight_l0_flag[i]); 
        if( sh->pwt.luma_weight_l0_flag[i] )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.luma_weight_l0[ i ] = bs_read_se(b); printf("sh->pwt.luma_weight_l0[ i ]: %d \n", sh->pwt.luma_weight_l0[ i ]); 
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.luma_offset_l0[ i ] = bs_read_se(b); printf("sh->pwt.luma_offset_l0[ i ]: %d \n", sh->pwt.luma_offset_l0[ i ]); 
        }
        if ( sps->chroma_format_idc != 0 ) //FIXME ChromaArrayType may differ from chroma_format_idc
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.chroma_weight_l0_flag[i] = bs_read_u1(b); printf("sh->pwt.chroma_weight_l0_flag[i]: %d \n", sh->pwt.chroma_weight_l0_flag[i]); 
            if( sh->pwt.chroma_weight_l0_flag[i] )
            {
                for( j =0; j < 2; j++ )
                {
                    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.chroma_weight_l0[ i ][ j ] = bs_read_se(b); printf("sh->pwt.chroma_weight_l0[ i ][ j ]: %d \n", sh->pwt.chroma_weight_l0[ i ][ j ]); 
                    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.chroma_offset_l0[ i ][ j ] = bs_read_se(b); printf("sh->pwt.chroma_offset_l0[ i ][ j ]: %d \n", sh->pwt.chroma_offset_l0[ i ][ j ]); 
                }
            }
        }
    }
    if( is_slice_type( sh->slice_type, SH_SLICE_TYPE_B ) )
    {
        for( i = 0; i <= pps->num_ref_idx_l1_active_minus1; i++ )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.luma_weight_l1_flag[i] = bs_read_u1(b); printf("sh->pwt.luma_weight_l1_flag[i]: %d \n", sh->pwt.luma_weight_l1_flag[i]); 
            if( sh->pwt.luma_weight_l1_flag[i] )
            {
                printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.luma_weight_l1[ i ] = bs_read_se(b); printf("sh->pwt.luma_weight_l1[ i ]: %d \n", sh->pwt.luma_weight_l1[ i ]); 
                printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.luma_offset_l1[ i ] = bs_read_se(b); printf("sh->pwt.luma_offset_l1[ i ]: %d \n", sh->pwt.luma_offset_l1[ i ]); 
            }
            if( sps->chroma_format_idc != 0 )
            {
                printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.chroma_weight_l1_flag[i] = bs_read_u1(b); printf("sh->pwt.chroma_weight_l1_flag[i]: %d \n", sh->pwt.chroma_weight_l1_flag[i]); 
                if( sh->pwt.chroma_weight_l1_flag[i] )
                {
                    for( j = 0; j < 2; j++ )
                    {
                        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.chroma_weight_l1[ i ][ j ] = bs_read_se(b); printf("sh->pwt.chroma_weight_l1[ i ][ j ]: %d \n", sh->pwt.chroma_weight_l1[ i ][ j ]); 
                        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.chroma_offset_l1[ i ][ j ] = bs_read_se(b); printf("sh->pwt.chroma_offset_l1[ i ][ j ]: %d \n", sh->pwt.chroma_offset_l1[ i ][ j ]); 
                    }
                }
            }
        }
    }
}